

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

int backtrack_leftmost(saucy *s)

{
  int iVar1;
  int local_1c;
  int min;
  int repsize;
  int rep;
  saucy *s_local;
  
  iVar1 = find_representative(s->indmin,s->theta);
  iVar1 = s->thsize[iVar1];
  local_1c = -1;
  pick_all_the_pairs(s);
  clear_undiffnons(s);
  s->ndiffnons = 0;
  s->npairs = 0;
  s->nundiffs = 0;
  s->ndiffs = 0;
  if (iVar1 != (s->right).clen[s->start[s->lev]] + 1) {
    local_1c = theta_prune(s);
  }
  if (local_1c == -1) {
    multiply_index(s,iVar1);
  }
  return local_1c;
}

Assistant:

static int
backtrack_leftmost(struct saucy *s)
{
    int rep = find_representative(s->indmin, s->theta);
    int repsize = s->thsize[rep];
    int min = -1;

    pick_all_the_pairs(s);
    clear_undiffnons(s);
    s->ndiffs = s->nundiffs = s->npairs = s->ndiffnons = 0;

    if (repsize != s->right.clen[s->start[s->lev]]+1) {
        min = theta_prune(s);
    }

    if (min == -1) {
        multiply_index(s, repsize);
    }

    return min;
}